

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::texImage3D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int width,
          int height,int depth,int border,deUint32 format,deUint32 type,void *data)

{
  long lVar1;
  DataBuffer *pDVar2;
  pointer puVar3;
  uint uVar4;
  undefined4 extraout_EAX;
  uint uVar5;
  undefined4 extraout_EAX_00;
  CubeFace face;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  ConstPixelBufferAccess *this_00;
  pointer puVar6;
  ConstPixelBufferAccess *pCVar7;
  uint level_00;
  TextureCube *this_01;
  Texture3D *this_02;
  pointer pTVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  TextureFormat local_198;
  uint local_190;
  int local_18c;
  pointer local_188;
  TextureFormat local_180;
  ConstPixelBufferAccess dst;
  PixelBufferAccess dst_1;
  ConstPixelBufferAccess local_120;
  ConstPixelBufferAccess local_f8;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  pDVar2 = this->m_pixelUnpackBufferBinding;
  if (pDVar2 != (DataBuffer *)0x0) {
    puVar3 = (pDVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pointer)0x0;
    if (puVar3 != (pDVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      puVar6 = puVar3;
    }
    data = (void *)((long)data + (long)puVar6);
  }
  if ((border != 0) || ((width | level | height | depth) < 0)) goto LAB_004842e5;
  pTVar8 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  local_18c = height;
  local_188 = (pointer)data;
  local_198 = mapInternalFormat(internalFormat);
  if ((local_198.order == CHANNELORDER_LAST || local_198.type == CHANNELTYPE_LAST) ||
     (local_190 = level, local_180 = glu::mapGLTransferFormat(format,type), iVar12 = local_18c,
     level_00 = local_190,
     local_180.order == CHANNELORDER_LAST || ((ulong)local_180 & 0xffffffff00000000) == 0x2600000000
     )) {
LAB_0048439f:
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (target == 0xde1) {
    uVar5 = (this->m_limits).maxTexture2DSize;
    if (((int)uVar5 < width) || (depth != 1 || (int)uVar5 < local_18c)) {
LAB_004842e5:
      if (this->m_lastError == 0) {
        this->m_lastError = 0x501;
      }
      return;
    }
    if (uVar5 == 0) {
      uVar4 = 0x20;
    }
    else {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    if ((int)(0x1f - uVar4) < (int)local_190) goto LAB_004842e5;
    this_02 = (Texture3D *)&pTVar8->default2DTex;
    if (pTVar8->tex2DBinding != (Texture2D *)0x0) {
      this_02 = (Texture3D *)pTVar8->tex2DBinding;
    }
    if ((((Texture2D *)this_02)->super_Texture).m_immutable == true) {
      if ((0xd < local_190) || ((((Texture2D *)this_02)->m_levels).m_data[local_190].m_cap == 0)) {
LAB_00484bdc:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&dst,&(((Texture2D *)this_02)->m_levels).m_access[local_190].
                       super_ConstPixelBufferAccess);
      auVar14._0_4_ = -(uint)(local_198.order == dst.m_format.order);
      auVar14._4_4_ = -(uint)(local_198.type == dst.m_format.type);
      auVar14._8_4_ = -(uint)(width == dst.m_size.m_data[0]);
      auVar14._12_4_ = -(uint)(iVar12 == dst.m_size.m_data[1]);
      iVar13 = movmskps(extraout_EAX_00,auVar14);
      if (iVar13 != 0xf) goto LAB_00484bdc;
    }
    else {
      rc::Texture2D::allocLevel((Texture2D *)this_02,local_190,&local_198,width,local_18c);
    }
    if (local_188 == (pointer)0x0) {
      pCVar7 = &(((Texture2D *)this_02)->m_levels).m_access[(int)level_00].
                super_ConstPixelBufferAccess;
      this_00 = &local_80;
LAB_00484c73:
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(this_00,pCVar7);
      clearToTextureInitialValue((PixelBufferAccess *)this_00);
      return;
    }
    getUnpack2DAccess(&dst,this,&local_180,width,iVar12,local_188);
  }
  else if (target == 0xde0) {
    if (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) != 0x100) goto LAB_0048439f;
    if (((depth != 1) || (local_18c != 1)) ||
       (uVar5 = (this->m_limits).maxTexture2DSize, (int)uVar5 < width)) goto LAB_004842e5;
    if (uVar5 == 0) {
      uVar4 = 0x20;
    }
    else {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    if ((int)(0x1f - uVar4) < (int)local_190) goto LAB_004842e5;
    this_02 = (Texture3D *)&pTVar8->default1DTex;
    if (pTVar8->tex1DBinding != (Texture1D *)0x0) {
      this_02 = (Texture3D *)pTVar8->tex1DBinding;
    }
    if ((((Texture1D *)this_02)->super_Texture).m_immutable == true) {
      if ((0xd < local_190) || ((((Texture1D *)this_02)->m_levels).m_data[local_190].m_cap == 0))
      goto LAB_00484bdc;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&dst,&(((Texture1D *)this_02)->m_levels).m_access[local_190].
                       super_ConstPixelBufferAccess);
      iVar12 = -(uint)(dst.m_format.order == local_198.order);
      iVar13 = -(uint)(dst.m_format.type == local_198.type);
      auVar9._4_4_ = iVar12;
      auVar9._0_4_ = iVar12;
      auVar9._8_4_ = iVar13;
      auVar9._12_4_ = iVar13;
      uVar5 = movmskpd(extraout_EAX,auVar9);
      if (((uVar5 & 1) == 0) || (((byte)((byte)uVar5 >> 1) == 0 || (dst.m_size.m_data[0] != width)))
         ) goto LAB_00484bdc;
    }
    else {
      rc::Texture1D::allocLevel((Texture1D *)this_02,local_190,&local_198,width);
    }
    if (local_188 == (pointer)0x0) {
      pCVar7 = &(((Texture1D *)this_02)->m_levels).m_access[(int)level_00].
                super_ConstPixelBufferAccess;
      this_00 = &local_58;
      goto LAB_00484c73;
    }
    getUnpack2DAccess(&dst,this,&local_180,width,1,local_188);
  }
  else {
    if (target - 0x8515 < 6) {
      if ((width != local_18c) ||
         (uVar5 = (this->m_limits).maxTextureCubeSize, depth != 1 || (int)uVar5 < width))
      goto LAB_004842e5;
      if (uVar5 == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      if ((int)(0x1f - uVar4) < (int)local_190) goto LAB_004842e5;
      this_01 = &pTVar8->defaultCubeTex;
      if (pTVar8->texCubeBinding != (TextureCube *)0x0) {
        this_01 = pTVar8->texCubeBinding;
      }
      face = mapGLCubeFace(target);
      if ((this_01->super_Texture).m_immutable == true) {
        if ((0xd < level_00) || (this_01->m_levels[face].m_data[level_00].m_cap == 0))
        goto LAB_00484bdc;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&dst,&this_01->m_levels[face].m_access[level_00].super_ConstPixelBufferAccess);
        auVar10._0_4_ = -(uint)(local_198.order == dst.m_format.order);
        auVar10._4_4_ = -(uint)(local_198.type == dst.m_format.type);
        auVar10._8_4_ = -(uint)(width == dst.m_size.m_data[0]);
        auVar10._12_4_ = -(uint)(width == dst.m_size.m_data[1]);
        iVar12 = movmskps(extraout_EAX_01,auVar10);
        if (iVar12 != 0xf) goto LAB_00484bdc;
      }
      else {
        rc::TextureCube::allocFace(this_01,level_00,face,&local_198,width,width);
      }
      if (local_188 == (pointer)0x0) {
        pCVar7 = &this_01->m_levels[face].m_access[(int)level_00].super_ConstPixelBufferAccess;
        this_00 = &local_a8;
        goto LAB_00484c73;
      }
      getUnpack2DAccess(&dst,this,&local_180,width,width,local_188);
      lVar1 = (long)this_01->m_levels[face].m_data + (long)(int)level_00 * 0x28 + -0x60;
      goto LAB_00484ad3;
    }
    if (target == 0x806f) {
      uVar5 = (this->m_limits).maxTexture3DSize;
      if ((((int)uVar5 < depth) || ((int)uVar5 < width)) || ((int)uVar5 < local_18c))
      goto LAB_004842e5;
      if (uVar5 == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      if ((int)(0x1f - uVar4) < (int)local_190) goto LAB_004842e5;
      this_02 = &pTVar8->default3DTex;
      if (pTVar8->tex3DBinding != (Texture3D *)0x0) {
        this_02 = pTVar8->tex3DBinding;
      }
      if ((this_02->super_Texture).m_immutable == true) {
        if ((0xd < local_190) || ((this_02->m_levels).m_data[local_190].m_cap == 0))
        goto LAB_00484bdc;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&dst,&(this_02->m_levels).m_access[local_190].super_ConstPixelBufferAccess);
        auVar15._0_4_ = -(uint)(local_198.order == dst.m_format.order);
        auVar15._4_4_ = -(uint)(local_198.type == dst.m_format.type);
        auVar15._8_4_ = -(uint)(width == dst.m_size.m_data[0]);
        auVar15._12_4_ = -(uint)(iVar12 == dst.m_size.m_data[1]);
        iVar13 = movmskps(extraout_EAX_02,auVar15);
        if ((iVar13 != 0xf) || (dst.m_size.m_data[2] != depth)) goto LAB_00484bdc;
      }
      else {
        rc::TextureLevelArray::allocLevel
                  (&this_02->m_levels,local_190,&local_198,width,local_18c,depth);
      }
      if (local_188 == (pointer)0x0) {
        pCVar7 = &(this_02->m_levels).m_access[(int)level_00].super_ConstPixelBufferAccess;
        this_00 = &local_f8;
        goto LAB_00484c73;
      }
    }
    else if (target == 0x9009) {
      if (((width != local_18c) || ((uint)depth % 6 != 0)) ||
         ((uVar5 = (this->m_limits).maxTexture2DSize, (int)uVar5 < width ||
          ((this->m_limits).maxTexture2DArrayLayers < depth)))) goto LAB_004842e5;
      if (uVar5 == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      if ((int)(0x1f - uVar4) < (int)local_190) goto LAB_004842e5;
      this_02 = (Texture3D *)&pTVar8->defaultCubeArrayTex;
      if ((Texture3D *)pTVar8->texCubeArrayBinding != (Texture3D *)0x0) {
        this_02 = (Texture3D *)pTVar8->texCubeArrayBinding;
      }
      if ((this_02->super_Texture).m_immutable == true) {
        if ((0xd < local_190) || ((this_02->m_levels).m_data[local_190].m_cap == 0))
        goto LAB_00484bdc;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&dst,&(this_02->m_levels).m_access[local_190].super_ConstPixelBufferAccess);
        auVar11._0_4_ = -(uint)(local_198.order == dst.m_format.order);
        auVar11._4_4_ = -(uint)(local_198.type == dst.m_format.type);
        auVar11._8_4_ = -(uint)(width == dst.m_size.m_data[0]);
        auVar11._12_4_ = -(uint)(width == dst.m_size.m_data[1]);
        iVar12 = movmskps(extraout_EAX_04,auVar11);
        if ((iVar12 != 0xf) || (level_00 = local_190, dst.m_size.m_data[2] != depth))
        goto LAB_00484bdc;
      }
      else {
        rc::TextureLevelArray::allocLevel(&this_02->m_levels,local_190,&local_198,width,width,depth)
        ;
      }
      iVar12 = width;
      if (local_188 == (pointer)0x0) {
        pCVar7 = &(this_02->m_levels).m_access[(int)level_00].super_ConstPixelBufferAccess;
        this_00 = &local_120;
        goto LAB_00484c73;
      }
    }
    else {
      if (target != 0x8c1a) goto LAB_0048439f;
      uVar5 = (this->m_limits).maxTexture2DSize;
      if ((((int)uVar5 < width) || ((int)uVar5 < local_18c)) ||
         ((this->m_limits).maxTexture2DArrayLayers < depth)) goto LAB_004842e5;
      if (uVar5 == 0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = uVar4 ^ 0x1f;
      }
      if ((int)(0x1f - uVar4) < (int)local_190) goto LAB_004842e5;
      this_02 = (Texture3D *)&pTVar8->default2DArrayTex;
      if ((Texture3D *)pTVar8->tex2DArrayBinding != (Texture3D *)0x0) {
        this_02 = (Texture3D *)pTVar8->tex2DArrayBinding;
      }
      if ((this_02->super_Texture).m_immutable == true) {
        if ((0xd < local_190) || ((this_02->m_levels).m_data[local_190].m_cap == 0))
        goto LAB_00484bdc;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&dst,&(this_02->m_levels).m_access[local_190].super_ConstPixelBufferAccess);
        auVar16._0_4_ = -(uint)(local_198.order == dst.m_format.order);
        auVar16._4_4_ = -(uint)(local_198.type == dst.m_format.type);
        auVar16._8_4_ = -(uint)(width == dst.m_size.m_data[0]);
        auVar16._12_4_ = -(uint)(iVar12 == dst.m_size.m_data[1]);
        iVar13 = movmskps(extraout_EAX_03,auVar16);
        if ((iVar13 != 0xf) || (dst.m_size.m_data[2] != depth)) goto LAB_00484bdc;
      }
      else {
        rc::TextureLevelArray::allocLevel
                  (&this_02->m_levels,local_190,&local_198,width,local_18c,depth);
      }
      if (local_188 == (pointer)0x0) {
        pCVar7 = &(this_02->m_levels).m_access[(int)level_00].super_ConstPixelBufferAccess;
        this_00 = &local_d0;
        goto LAB_00484c73;
      }
    }
    getUnpack3DAccess(&dst,this,&local_180,width,iVar12,depth,local_188);
  }
  lVar1 = (long)(this_02->m_levels).m_data + (long)(int)level_00 * 0x28 + -0x60;
LAB_00484ad3:
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&dst_1.super_ConstPixelBufferAccess,(ConstPixelBufferAccess *)(lVar1 + 0x140));
  if ((internalFormat & 0xfffffffe) == 0x8cac) {
    depthValueFloatClampCopy(&dst_1,&dst);
    return;
  }
  tcu::copy((EVP_PKEY_CTX *)&dst_1,(EVP_PKEY_CTX *)&dst);
  return;
}

Assistant:

void ReferenceContext::texImage3D (deUint32 target, int level, deUint32 internalFormat, int width, int height, int depth, int border, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit&		unit					= m_textureUnits[m_activeTexture];
	const void*			unpackPtr				= getPixelUnpackPtr(data);
	const bool			isDstFloatDepthFormat	= (internalFormat == GL_DEPTH_COMPONENT32F || internalFormat == GL_DEPTH32F_STENCIL8); // depth components are limited to [0,1] range
	TextureFormat		storageFmt;
	TextureFormat		transferFmt;

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	// Map transfer format.
	transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height != 1 || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, 1, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getFace(level, face));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getFace(level, face));
		}
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture2DSize ||
					height	> m_limits.maxTexture2DSize ||
					depth	> m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2DArray* texture = unit.tex2DArrayBinding ? unit.tex2DArrayBinding : &unit.default2DArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_3D)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture3DSize ||
					height	> m_limits.maxTexture3DSize ||
					depth	> m_limits.maxTexture3DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture3DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture3D* texture = unit.tex3DBinding ? unit.tex3DBinding : &unit.default3DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width		!= height						||
					width		 > m_limits.maxTexture2DSize	||
					depth % 6	!= 0							||
					depth		 > m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCubeArray* texture = unit.texCubeArrayBinding ? unit.texCubeArrayBinding : &unit.defaultCubeArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}